

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::
     LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *p_lhs,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_rhs)

{
  bool bVar1;
  type_conflict5 tVar2;
  double *pdVar3;
  ostream *os;
  char *pcVar4;
  cpp_dec_float<200U,_int,_void> local_a0;
  
  LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (p_lp,p_output,p_cnames,p_svec,false);
  bVar1 = boost::multiprecision::operator==(p_lhs,p_rhs);
  if (bVar1) {
    pcVar4 = " = ";
  }
  else {
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_a0,-*pdVar3,(type *)0x0);
    tVar2 = boost::multiprecision::operator<=
                      (p_lhs,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_a0);
    if (!tVar2) {
      os = std::operator<<(p_output," >= ");
      p_rhs = p_lhs;
      goto LAB_001364fa;
    }
    pcVar4 = " <= ";
  }
  os = std::operator<<(p_output,pcVar4);
LAB_001364fa:
  boost::multiprecision::operator<<(os,p_rhs);
  std::operator<<(p_output,"\n");
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<R>&   p_lp,       ///< the LP
   std::ostream&         p_output,   ///< output stream
   const NameSet*        p_cnames,   ///< column names
   const SVectorBase<R>& p_svec,     ///< vector of the row
   const R&              p_lhs,      ///< lhs of the row
   const R&              p_rhs       ///< rhs of the row
)
{

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec);

   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(p_lhs <= R(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(p_rhs >= R(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";
}